

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

void __thiscall
TasGrid::Optimizer::CurrentNodes<(TasGrid::TypeOneDRule)15>::~CurrentNodes
          (CurrentNodes<(TasGrid::TypeOneDRule)15> *this)

{
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->coeff).super__Vector_base<double,_std::allocator<double>_>);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)this);
  return;
}

Assistant:

CurrentNodes(std::vector<double> const &cnodes)
        : nodes(cnodes), coeff(makeCoefficients(cnodes)){}